

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O3

void LibGens::Ym2612Private::doStaticInit(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *piVar3;
  int i_2;
  ulong uVar4;
  int i_1;
  int i;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  int iVar11;
  int iVar12;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double dVar18;
  undefined1 auVar16 [16];
  double dVar19;
  undefined1 auVar20 [16];
  double dVar23;
  undefined1 auVar21 [16];
  int iVar17;
  uint uVar22;
  int iVar24;
  
  SIN_TAB._0_8_ = &TL_TAB + PG_CUT_OFF;
  lVar5 = 1;
  lVar6 = 0x7ff;
  SIN_TAB._16384_8_ = SIN_TAB._0_8_;
  do {
    dVar7 = sin((double)(int)lVar5 * 6.283185307179586 * 0.000244140625);
    dVar7 = log10(1.0 / dVar7);
    iVar2 = (int)((dVar7 * 20.0) / 0.0234375);
    if (PG_CUT_OFF < iVar2) {
      iVar2 = PG_CUT_OFF;
    }
    *(undefined4 **)(SIN_TAB + lVar6 * 8) = &TL_TAB + iVar2;
    *(undefined4 **)(SIN_TAB + lVar5 * 8) = &TL_TAB + iVar2;
    *(undefined4 **)(SIN_TAB + lVar6 * 8 + 0x4000) = &DAT_0023e1f0 + iVar2;
    *(undefined4 **)(SIN_TAB + lVar5 * 8 + 0x4000) = &DAT_0023e1f0 + iVar2;
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0x3ff);
  lVar6 = 0;
  lVar5 = 0;
  do {
    dVar7 = (double)(int)lVar5 * 6.283185307179586 * 0.0009765625;
    dVar8 = sin(dVar7);
    *(int *)((long)&LFO_ENV_TAB + lVar6) = (int)((dVar8 + 1.0) * 0.5 * 503.4666666666667);
    dVar7 = sin(dVar7);
    *(int *)((long)&LFO_FREQ_TAB + lVar6) = (int)(dVar7 * 511.0);
    auVar1 = _DAT_001b26a0;
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 4;
  } while (lVar5 != 0x400);
  lVar5 = -0x1000;
  auVar9 = _DAT_001b2690;
  auVar13 = _DAT_001b2690;
  do {
    auVar15._0_4_ = 0xfff - auVar9._0_4_;
    iVar2 = auVar9._4_4_;
    iVar11 = auVar9._8_4_;
    iVar12 = auVar9._12_4_;
    auVar20._4_4_ = 0;
    auVar20._0_4_ = 0xfff - iVar11;
    auVar20._8_4_ = 0xfff - iVar12;
    auVar20._12_4_ = 0;
    dVar7 = auVar1._0_8_;
    dVar8 = auVar1._8_8_;
    auVar15._4_4_ = 0;
    auVar15._8_4_ = 0xfff - iVar2;
    auVar15._12_4_ = 0;
    dVar14 = (SUB168(auVar15 | auVar1,0) - dVar7) * 0.000244140625;
    dVar18 = (SUB168(auVar15 | auVar1,8) - dVar8) * 0.000244140625;
    dVar19 = (SUB168(auVar20 | auVar1,0) - dVar7) * 0.000244140625;
    dVar23 = (SUB168(auVar20 | auVar1,8) - dVar8) * 0.000244140625;
    dVar19 = dVar19 * dVar19;
    dVar23 = dVar23 * dVar23;
    dVar19 = dVar19 * dVar19;
    dVar23 = dVar23 * dVar23;
    dVar14 = dVar14 * dVar14;
    dVar18 = dVar18 * dVar18;
    dVar14 = dVar14 * dVar14;
    dVar18 = dVar18 * dVar18;
    *(ulong *)(ENV_TAB + lVar5 * 4 + 0x4000) =
         CONCAT44((int)(dVar18 * dVar18 * 4096.0),(int)(dVar14 * dVar14 * 4096.0));
    *(ulong *)(ENV_TAB + lVar5 * 4 + 0x4008) =
         CONCAT44((int)(dVar23 * dVar23 * 4096.0),(int)(dVar19 * dVar19 * 4096.0));
    iVar17 = auVar13._4_4_;
    auVar16._0_8_ = auVar13._0_8_ & 0xffffffff;
    auVar16._8_4_ = iVar17;
    auVar16._12_4_ = 0;
    uVar22 = auVar13._8_4_;
    auVar21._4_4_ = 0;
    auVar21._0_4_ = uVar22;
    iVar24 = auVar13._12_4_;
    auVar21._8_4_ = iVar24;
    auVar21._12_4_ = 0;
    *(ulong *)(ENV_TAB + lVar5 * 4 + 0x8000) =
         CONCAT44((int)((SUB168(auVar16 | auVar1,8) - dVar8) * 0.000244140625 * 4096.0),
                  (int)((SUB168(auVar16 | auVar1,0) - dVar7) * 0.000244140625 * 4096.0));
    *(ulong *)(ENV_TAB + lVar5 * 4 + 0x8008) =
         CONCAT44((int)((SUB168(auVar21 | auVar1,8) - dVar8) * 0.000244140625 * 4096.0),
                  (int)((SUB168(auVar21 | auVar1,0) - dVar7) * 0.000244140625 * 4096.0));
    auVar9._0_4_ = auVar9._0_4_ + 4;
    auVar9._4_4_ = iVar2 + 4;
    auVar9._8_4_ = iVar11 + 4;
    auVar9._12_4_ = iVar12 + 4;
    auVar13._0_4_ = auVar13._0_4_ + 4;
    auVar13._4_4_ = iVar17 + 4;
    auVar13._8_4_ = uVar22 + 4;
    auVar13._12_4_ = iVar24 + 4;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0);
  ENV_TAB._32768_4_ = 0xfff;
  iVar2 = 0xfff;
  uVar4 = 0;
  do {
    iVar11 = 0;
    if (iVar2 != 0) {
      lVar5 = 0;
      do {
        if (uVar4 <= *(uint *)(ENV_TAB + (long)iVar2 * 4 + lVar5 * 4)) {
          iVar11 = iVar2 + (int)lVar5;
          goto LAB_00161f1f;
        }
        lVar5 = lVar5 + -1;
      } while (-lVar5 != (long)iVar2);
      iVar11 = 0;
    }
LAB_00161f1f:
    iVar2 = iVar11;
    (&DECAY_TO_ATTACK)[uVar4] = iVar2 << 0x10;
    auVar1 = _DAT_001a83d0;
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x1000) {
      piVar3 = &DAT_0028e1f4;
      lVar5 = 0;
      auVar10 = _DAT_001a83c0;
      do {
        if (SUB164(auVar10 ^ auVar1,4) == -0x80000000 && SUB164(auVar10 ^ auVar1,0) < -0x7ffffff1) {
          piVar3[-1] = (int)((double)(int)lVar5 / 0.0234375) * 0x10000 + 0x10000000;
          *piVar3 = (int)((double)((int)lVar5 + 3) / 0.0234375) * 0x10000 + 0x10000000;
        }
        lVar6 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar6 + 2;
        piVar3 = piVar3 + 2;
        lVar5 = lVar5 + 6;
      } while (lVar5 != 0x30);
      _DAT_0028e22c = 0x1fff0000;
      lVar5 = 0;
      iVar2 = PG_CUT_OFF;
      do {
        if (lVar5 < iVar2) {
          dVar7 = pow(10.0,((double)(int)lVar5 * 0.0234375) / 20.0);
          (&TL_TAB)[lVar5] = (int)(268435455.0 / dVar7);
          (&DAT_0023e1f0)[lVar5] = -(int)(268435455.0 / dVar7);
          iVar2 = PG_CUT_OFF;
        }
        else {
          (&TL_TAB)[lVar5] = 0;
          (&DAT_0023e1f0)[lVar5] = 0;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x3000);
      NULL_RATE._112_8_ = 0;
      NULL_RATE._120_8_ = 0;
      NULL_RATE._96_8_ = 0;
      NULL_RATE._104_8_ = 0;
      NULL_RATE._80_8_ = 0;
      NULL_RATE._88_8_ = 0;
      NULL_RATE._64_8_ = 0;
      NULL_RATE._72_8_ = 0;
      NULL_RATE._48_8_ = 0;
      NULL_RATE._56_8_ = 0;
      NULL_RATE._32_8_ = 0;
      NULL_RATE._40_8_ = 0;
      NULL_RATE._16_8_ = 0;
      NULL_RATE._24_8_ = 0;
      NULL_RATE._0_8_ = 0;
      NULL_RATE._8_8_ = 0;
      return;
    }
  } while( true );
}

Assistant:

void Ym2612Private::doStaticInit(void)
{
	// Sine table:
	// SIN_TAB[x][y] = sin(x) * y;
	// x = phase and y = volume
	SIN_TAB[0] = SIN_TAB[SIN_LENGTH / 2] = &TL_TAB[(int)PG_CUT_OFF];

	for (int i = 1; i <= SIN_LENGTH / 4; i++) {
		double x = sin(2.0 * PI * (double) (i) / (double) (SIN_LENGTH));	// Sinus
		x = 20 * log10(1 / x);	// convert to dB

		int j = (int)(x / ENV_STEP);	// Get TL range
		if (j > PG_CUT_OFF) {
			j = (int) PG_CUT_OFF;
		}

		SIN_TAB[i] = SIN_TAB[(SIN_LENGTH / 2) - i] = &TL_TAB[j];
		SIN_TAB[(SIN_LENGTH / 2) + i] = SIN_TAB[SIN_LENGTH - i] = &TL_TAB[TL_LENGTH + j];

//		LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG3,
//			"SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X",
//			i, SIN_TAB[i][0], (SIN_LENGTH / 2) - i,
//			SIN_TAB[(SIN_LENGTH / 2) - i][0], (SIN_LENGTH / 2) + i,
//			SIN_TAB[(SIN_LENGTH / 2) + i][0], SIN_LENGTH - i,
//			SIN_TAB[SIN_LENGTH - i][0]);
	}

	// LFO table:
	for (int i = 0; i < LFO_LENGTH; i++) {
		double x = sin (2.0 * PI * (double) (i) / (double) (LFO_LENGTH));	// Sinus
		x += 1.0;
		x /= 2.0;		// positive only
		x *= 11.8 / ENV_STEP;	// adjusted to MAX envelope modulation

		LFO_ENV_TAB[i] = (int) x;

		x = sin(2.0 * PI * (double) (i) / (double) (LFO_LENGTH));	// Sinus
		x *= (double) ((1 << (LFO_HBITS - 1)) - 1);

		LFO_FREQ_TAB[i] = (int) x;

//		LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG3,
//			"LFO[%d] = %.8X", i, LFO_ENV_TAB[i]);
	}

	// Envelope table:
	// ENV_TAB[0] -> ENV_TAB[ENV_LENGTH - 1]              = attack curve
	// ENV_TAB[ENV_LENGTH] -> ENV_TAB[2 * ENV_LENGTH - 1] = decay curve
	for (int i = 0; i < ENV_LENGTH; i++) {
		// Attack curve (x^8 - music level 2 Vectorman 2)
		double x = pow(((double)((ENV_LENGTH - 1) - i) / (double)(ENV_LENGTH)), 8);
		x *= ENV_LENGTH;

		ENV_TAB[i] = (int)x;

		// Decay curve (just linear)
		x = pow(((double) (i) / (double) (ENV_LENGTH)), 1);
		x *= ENV_LENGTH;

		ENV_TAB[ENV_LENGTH + i] = (int)x;

//		LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG3,
//			"ATTACK[%d] = %d   DECAY[%d] = %d",
//			i, ENV_TAB[i], i, ENV_TAB[ENV_LENGTH + i]);
	}

	ENV_TAB[ENV_END >> ENV_LBITS] = ENV_LENGTH - 1;	// for the stopped state

	// Decay -> Attack table.
	// NOTE: There used to be an Attack -> Decay table,
	// but it wasn't implemented as of the original
	// port of Gens for Linux...
	for (int i = 0, j = ENV_LENGTH - 1; i < ENV_LENGTH; i++) {
		while (j && (ENV_TAB[j] < (unsigned) i))
			j--;

		DECAY_TO_ATTACK[i] = j << ENV_LBITS;
	}

	// Sustain Level table:
	for (int i = 0; i < 15; i++) {
		double x = i * 3;		// 3 and not 6 (Mickey Mania first music for test)
		x /= ENV_STEP;

		int j = (int)x;
		j <<= ENV_LBITS;

		SL_TAB[i] = j + ENV_DECAY;
	}

	int j = ENV_LENGTH - 1;		// special case : volume off
	j <<= ENV_LBITS;
	SL_TAB[15] = j + ENV_DECAY;

	// TL table:
	// [0     -  4095] = +output  [4095  - ...] = +output overflow (fill with 0)
	// [12288 - 16383] = -output  [16384 - ...] = -output overflow (fill with 0)
	for (int i = 0; i < TL_LENGTH; i++) {
		if (i >= PG_CUT_OFF) {
			// YM2612 cut off sound after 78 dB (14 bits output ?)
			TL_TAB[TL_LENGTH + i] = TL_TAB[i] = 0;
		} else {
			double x = MAX_OUT;			// Max output
			x /= pow(10, (ENV_STEP * i) / 20);	// Decibel -> Voltage

			TL_TAB[i] = (int) x;
			TL_TAB[TL_LENGTH + i] = -TL_TAB[i];
		}

//		LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG3,
//			"TL_TAB[%d] = %.8X    TL_TAB[%d] = %.8X",
//			i, TL_TAB[i], TL_LENGTH + i, TL_TAB[TL_LENGTH + i]);
	}

	// NULL frequency rate table.
	// It's always 0.
	memset(NULL_RATE, 0, sizeof(NULL_RATE));
}